

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.cxx
# Opt level: O1

int main(void)

{
  uchar *puVar1;
  int iVar2;
  __sighandler_t p_Var3;
  PressedKey PVar4;
  system_error *this;
  int *piVar5;
  error_category *__ecat;
  long lVar6;
  array<int,_2UL> signals;
  LinuxKeys linuxKeys;
  OledI2C oled;
  Bitmap pixels;
  cc_t local_8e8 [8];
  LinuxKeys local_8e0;
  undefined1 local_8a0 [1144];
  Bitmap local_428;
  
  local_8e8[0] = '\x02';
  local_8e8[1] = '\0';
  local_8e8[2] = '\0';
  local_8e8[3] = '\0';
  local_8e8[4] = '\x0f';
  local_8e8[5] = '\0';
  local_8e8[6] = '\0';
  local_8e8[7] = '\0';
  lVar6 = 0;
  do {
    iVar2 = *(int *)(local_8e0.originalTermios_.c_cc + lVar6 + -0x1d);
    p_Var3 = signal(iVar2,signalHandler);
    if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
      local_8a0._0_8_ = local_8a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,"installing ","");
      strsignal(iVar2);
      std::__cxx11::string::append(local_8a0);
      std::__cxx11::string::append(local_8a0);
      this = (system_error *)__cxa_allocate_exception(0x20);
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      __ecat = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this,iVar2,__ecat,(string *)local_8a0);
      __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 8);
  puVar1 = local_428.blocks_._M_elems[0]._M_elems + 8;
  local_428.super_OledPixel._vptr_OledPixel = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"/dev/i2c-1","");
  SSD1306::OledI2C::OledI2C((OledI2C *)local_8a0,(string *)&local_428,'<');
  if (local_428.super_OledPixel._vptr_OledPixel != (_func_int **)puVar1) {
    operator_delete(local_428.super_OledPixel._vptr_OledPixel,
                    local_428.blocks_._M_elems[0]._M_elems._8_8_ + 1);
  }
  local_428.super_OledPixel._vptr_OledPixel = (_func_int **)&PTR__OledPixel_00109b08;
  memset(&local_428.blocks_,0,0x400);
  newLife(&local_428.super_OledPixel);
  SSD1306::OledPixel::setFrom
            ((OledPixel *)(local_8a0 + 8),&local_428.super_OledPixel,(OledPoint)0x0);
  SSD1306::OledI2C::displayUpdate((OledI2C *)local_8a0);
  LinuxKeys::LinuxKeys(&local_8e0);
  while ((anonymous_namespace)::run != 0) {
    PVar4 = LinuxKeys::pressed(&local_8e0);
    if (((ulong)PVar4 & 1) != 0) {
      iVar2 = PVar4.key;
      if (iVar2 < 0x2b) {
        if (iVar2 == 0x1b) {
          (anonymous_namespace)::run = 0;
        }
        else if (iVar2 == 0x20) {
          newLife(&local_428.super_OledPixel);
        }
      }
      else if (iVar2 == 0x2b) {
        SSD1306::OledI2C::displayOn((OledI2C *)local_8a0);
      }
      else if (iVar2 == 0x2d) {
        SSD1306::OledI2C::displayOff((OledI2C *)local_8a0);
      }
    }
    iterateLife(&local_428);
    SSD1306::OledPixel::setFrom
              ((OledPixel *)(local_8a0 + 8),&local_428.super_OledPixel,(OledPoint)0x0);
    SSD1306::OledI2C::displayUpdate((OledI2C *)local_8a0);
  }
  SSD1306::OledI2C::clear((OledI2C *)local_8a0);
  SSD1306::OledI2C::displayUpdate((OledI2C *)local_8a0);
  LinuxKeys::~LinuxKeys(&local_8e0);
  SSD1306::OledPixel::~OledPixel(&local_428.super_OledPixel);
  SSD1306::OledI2C::~OledI2C((OledI2C *)local_8a0);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        constexpr std::array<int, 2> signals{SIGINT, SIGTERM};

        for (auto signal : signals)
        {
            if (std::signal(signal, signalHandler) == SIG_ERR)
            {
                std::string what{"installing "};
                what += strsignal(signal);
                what += " signal handler";

                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }
        }

       SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        Bitmap pixels;

        newLife(pixels);
        oled.setFrom(pixels);
        oled.displayUpdate();

        LinuxKeys linuxKeys;
        LinuxKeys::PressedKey key;

        //-----------------------------------------------------------------

        while (run)
        {
            key = linuxKeys.pressed();
        
            if (key.isPressed)
            {
                switch (key.key)
                {
                case ' ':

                    newLife(pixels);
                    break;

                case '+':

                    oled.displayOn();
                    break;

                case '-':

                    oled.displayOff();
                    break;

                case 27:

                    run = 0;
                    break;
                }
            }

            iterateLife(pixels);
            oled.setFrom(pixels);
            oled.displayUpdate();
        }

        //-----------------------------------------------------------------

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}